

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-dtoa.cc
# Opt level: O0

void double_conversion::BiggestPowerTen
               (uint32_t number,int number_bits,uint32_t *power,int *exponent_plus_one)

{
  int iVar1;
  int exponent_plus_one_guess;
  int *exponent_plus_one_local;
  uint32_t *power_local;
  int number_bits_local;
  uint32_t number_local;
  
  iVar1 = (number_bits + 1) * 0x4d1 >> 0xc;
  exponent_plus_one_guess = iVar1 + 1;
  if (number < *(uint *)(kSmallPowersOfTen + (long)exponent_plus_one_guess * 4)) {
    exponent_plus_one_guess = iVar1;
  }
  *power = *(uint32_t *)(kSmallPowersOfTen + (long)exponent_plus_one_guess * 4);
  *exponent_plus_one = exponent_plus_one_guess;
  return;
}

Assistant:

static void BiggestPowerTen(uint32_t number,
                            int number_bits,
                            uint32_t* power,
                            int* exponent_plus_one) {
  DOUBLE_CONVERSION_ASSERT(number < (1u << (number_bits + 1)));
  // 1233/4096 is approximately 1/lg(10).
  int exponent_plus_one_guess = ((number_bits + 1) * 1233 >> 12);
  // We increment to skip over the first entry in the kPowersOf10 table.
  // Note: kPowersOf10[i] == 10^(i-1).
  exponent_plus_one_guess++;
  // We don't have any guarantees that 2^number_bits <= number.
  if (number < kSmallPowersOfTen[exponent_plus_one_guess]) {
    exponent_plus_one_guess--;
  }
  *power = kSmallPowersOfTen[exponent_plus_one_guess];
  *exponent_plus_one = exponent_plus_one_guess;
}